

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.c
# Opt level: O0

int EVP_PKEY_verify(EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  int ret;
  int local_4;
  
  if (ctx == (EVP_PKEY_CTX *)0x0) {
    ERR_new();
    ERR_set_debug((char *)siglen,(int)((ulong)tbs >> 0x20),(char *)tbslen);
    ERR_set_error(6,0x96,(char *)0x0);
    local_4 = -2;
  }
  else if (*(int *)ctx == 0x20) {
    if (*(long *)(ctx + 0x30) == 0) {
      if ((*(long *)(ctx + 0x78) == 0) || (*(long *)(*(long *)(ctx + 0x78) + 0x58) == 0)) {
        ERR_new();
        ERR_set_debug((char *)siglen,(int)((ulong)tbs >> 0x20),(char *)tbslen);
        ERR_set_error(6,0x96,(char *)0x0);
        local_4 = -2;
      }
      else {
        local_4 = (**(code **)(*(long *)(ctx + 0x78) + 0x58))(ctx,sig,siglen,tbs,tbslen);
      }
    }
    else {
      local_4 = (**(code **)(*(long *)(ctx + 0x28) + 0x50))
                          (*(undefined8 *)(ctx + 0x30),sig,siglen,tbs,tbslen);
    }
  }
  else {
    ERR_new();
    ERR_set_debug((char *)siglen,(int)((ulong)tbs >> 0x20),(char *)tbslen);
    ERR_set_error(6,0x97,(char *)0x0);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int EVP_PKEY_verify(EVP_PKEY_CTX *ctx,
                    const unsigned char *sig, size_t siglen,
                    const unsigned char *tbs, size_t tbslen)
{
    int ret;

    if (ctx == NULL) {
        ERR_raise(ERR_LIB_EVP, EVP_R_OPERATION_NOT_SUPPORTED_FOR_THIS_KEYTYPE);
        return -2;
    }

    if (ctx->operation != EVP_PKEY_OP_VERIFY) {
        ERR_raise(ERR_LIB_EVP, EVP_R_OPERATION_NOT_INITIALIZED);
        return -1;
    }

    if (ctx->op.sig.algctx == NULL)
        goto legacy;

    ret = ctx->op.sig.signature->verify(ctx->op.sig.algctx, sig, siglen,
                                        tbs, tbslen);

    return ret;
 legacy:
    if (ctx->pmeth == NULL || ctx->pmeth->verify == NULL) {
        ERR_raise(ERR_LIB_EVP, EVP_R_OPERATION_NOT_SUPPORTED_FOR_THIS_KEYTYPE);
        return -2;
    }

    return ctx->pmeth->verify(ctx, sig, siglen, tbs, tbslen);
}